

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_math.c
# Opt level: O0

double cosd(double angle)

{
  int iVar1;
  double in_XMM0_Qa;
  double dVar2;
  int i;
  double local_8;
  
  dVar2 = fmod(in_XMM0_Qa,90.0);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
switchD_00112195_default:
    local_8 = cos(in_XMM0_Qa * 0.017453292519943295);
  }
  else {
    dVar2 = floor(in_XMM0_Qa / 90.0 + 0.5);
    iVar1 = (int)dVar2;
    if (iVar1 < 1) {
      iVar1 = -iVar1;
    }
    switch(iVar1 % 4) {
    case 0:
      local_8 = 1.0;
      break;
    case 1:
      local_8 = 0.0;
      break;
    case 2:
      local_8 = -1.0;
      break;
    case 3:
      local_8 = 0.0;
      break;
    default:
      goto switchD_00112195_default;
    }
  }
  return local_8;
}

Assistant:

double cosd(double angle) {
    int i;

    if (fmod(angle, 90.0) == 0.0) {
        i = abs((int) floor(angle / 90.0 + 0.5)) % 4;
        switch (i) {
        case 0:
            return 1.0;
        case 1:
            return 0.0;
        case 2:
            return -1.0;
        case 3:
            return 0.0;
        }
    }

    return cos(angle * D2R);
}